

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper_sse4.cpp
# Opt level: O3

void storeA2RGB30PMFromARGB32PM_sse4<(QtPixelOrder)0>
               (uchar *dest,uint *src,int index,int count,QList<unsigned_int> *param_5,
               QDitherInfo *param_6)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  float fVar4;
  undefined1 auVar5 [16];
  float fVar6;
  undefined1 auVar7 [16];
  
  if (0 < count) {
    uVar2 = 0;
    do {
      uVar1 = src[uVar2];
      uVar3 = uVar1 >> 0x18;
      if (uVar3 != 0) {
        if (uVar3 == 0xff) {
          uVar3 = (uVar1 & 0xff00) * 0x10 +
                  ((uVar1 >> 6 & 3) + (uVar1 & 0xff) * 4 | uVar1 >> 2 & 0x300000 |
                   (uVar1 & 0xff0000) << 6 | uVar1 >> 4 & 0xc00) + 0xc0000000;
        }
        else {
          fVar4 = (float)uVar3;
          auVar7 = rcpss(ZEXT416((uint)fVar4),ZEXT416((uint)fVar4));
          fVar6 = auVar7._0_4_;
          fVar4 = ((fVar6 + fVar6) - fVar4 * fVar6 * fVar6) * (float)((uVar1 >> 0x1e) * 0x155);
          auVar7 = pmovzxbd(ZEXT416(uVar1),ZEXT416(uVar1));
          auVar5._0_4_ = (int)((float)auVar7._0_4_ * fVar4);
          auVar5._4_4_ = (int)((float)auVar7._4_4_ * fVar4);
          auVar5._8_4_ = (int)((float)auVar7._8_4_ * fVar4);
          auVar5._12_4_ = (int)((float)auVar7._12_4_ * fVar4);
          auVar7 = packusdw(auVar5,auVar5);
          uVar3 = (uint)auVar7._0_2_ | (uint)auVar7._4_2_ << 0x14 |
                  (uint)auVar7._2_2_ << 10 | uVar1 & 0xc0000000;
        }
      }
      *(uint *)(dest + uVar2 * 4 + (long)index * 4) = uVar3;
      uVar2 = uVar2 + 1;
    } while ((uint)count != uVar2);
  }
  return;
}

Assistant:

void QT_FASTCALL storeA2RGB30PMFromARGB32PM_sse4(uchar *dest, const uint *src, int index, int count,
                                                 const QList<QRgb> *, QDitherInfo *)
{
    uint *d = reinterpret_cast<uint *>(dest) + index;
    for (int i = 0; i < count; ++i)
        d[i] = qConvertArgb32ToA2rgb30_sse4<PixelOrder>(src[i]);
}